

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::emit_unary_instruction(Impl *impl,UnaryOperator *instruction)

{
  UnaryOps UVar1;
  Id arg;
  LoggingCallback p_Var2;
  void *pvVar3;
  Operation *this;
  Value *value;
  Type *type;
  Operation *op;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Op opcode;
  UnaryOperator *instruction_local;
  Impl *impl_local;
  
  UVar1 = LLVMBC::UnaryOperator::getOpcode(instruction);
  if (UVar1 == FNeg) {
    this = Converter::Impl::allocate(impl,OpFNegate,(Value *)instruction);
    value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,0);
    arg = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(this,arg);
    type = LLVMBC::Value::getType((Value *)instruction);
    Converter::Impl::decorate_relaxed_precision(impl,type,this->id,false);
    Converter::Impl::add(impl,this,false);
    impl_local._7_1_ = true;
  }
  else {
    p_Var2 = get_thread_log_callback();
    if (p_Var2 == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Unknown unary operator.\n");
      fflush(_stderr);
    }
    else {
      snprintf((char *)&op,0x1000,"Unknown unary operator.\n");
      pvVar3 = get_thread_log_callback_userdata();
      (*p_Var2)(pvVar3,Error,(char *)&op);
    }
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_unary_instruction(Converter::Impl &impl, const llvm::UnaryOperator *instruction)
{
	spv::Op opcode;

	switch (instruction->getOpcode())
	{
	case llvm::UnaryOperator::UnaryOps::FNeg:
		opcode = spv::OpFNegate;
		break;

	default:
		LOGE("Unknown unary operator.\n");
		return false;
	}

	Operation *op = impl.allocate(opcode, instruction);
	op->add_id(impl.get_id_for_value(instruction->getOperand(0)));
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);

	impl.add(op);
	return true;
}